

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelPackagePython.cpp
# Opt level: O0

PyObject * pybind11_init(void)

{
  PyObject *pPVar1;
  class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *pcVar2;
  class_<MPL::ModelPackage> *pcVar3;
  PyObject **ppPVar4;
  offset_in_ModelPackageItemInfo_to_subr local_100 [2];
  _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *local_f0;
  code *local_e8;
  undefined8 local_e0;
  code *local_d8;
  undefined8 local_d0;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  constructor<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_91;
  PyObject *local_90;
  class_<MPL::ModelPackage> local_88;
  code *local_80;
  undefined8 local_78;
  code *local_70;
  undefined8 local_68;
  code *local_60;
  undefined8 local_58;
  code *local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  PyObject *local_20;
  class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_> local_18;
  handle local_10;
  module m;
  
  pybind11::module_::module_
            ((module_ *)&local_10,"libmodelpackage",
             "Library to create, access and edit model packages");
  local_20 = local_10.m_ptr;
  pybind11::class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_>::class_<>
            (&local_18,local_10,"ModelPackageItemInfo");
  local_40 = MPL::ModelPackageItemInfo::identifier_abi_cxx11_;
  local_38 = 0;
  pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
           pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
           def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                     ((class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>
                       *)&local_18,"identifier",(offset_in_ModelPackageItemInfo_to_subr *)&local_40)
  ;
  local_50 = MPL::ModelPackageItemInfo::path_abi_cxx11_;
  local_48 = 0;
  pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
           pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
           def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                     (pcVar2,"path",(offset_in_ModelPackageItemInfo_to_subr *)&local_50);
  local_60 = MPL::ModelPackageItemInfo::name_abi_cxx11_;
  local_58 = 0;
  pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
           pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
           def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                     (pcVar2,"name",(offset_in_ModelPackageItemInfo_to_subr *)&local_60);
  local_70 = MPL::ModelPackageItemInfo::author_abi_cxx11_;
  local_68 = 0;
  pcVar2 = (class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>> *)
           pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
           def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
                     (pcVar2,"author",(offset_in_ModelPackageItemInfo_to_subr *)&local_70);
  local_80 = MPL::ModelPackageItemInfo::description_abi_cxx11_;
  local_78 = 0;
  pybind11::class_<MPL::ModelPackageItemInfo,std::shared_ptr<MPL::ModelPackageItemInfo>>::
  def<std::__cxx11::string_const&(MPL::ModelPackageItemInfo::*)()const>
            (pcVar2,"description",(offset_in_ModelPackageItemInfo_to_subr *)&local_80);
  pybind11::class_<MPL::ModelPackageItemInfo,_std::shared_ptr<MPL::ModelPackageItemInfo>_>::~class_
            (&local_18);
  local_90 = local_10.m_ptr;
  pybind11::class_<MPL::ModelPackage>::class_<>(&local_88,local_10,"ModelPackage");
  pybind11::init<std::__cxx11::string_const&>();
  pcVar3 = pybind11::class_<MPL::ModelPackage>::def<std::__cxx11::string_const&>
                     (&local_88,&local_91);
  local_a8 = MPL::ModelPackage::path_abi_cxx11_;
  local_a0 = 0;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::
           def<std::__cxx11::string(MPL::ModelPackage::*)()const>
                     (pcVar3,"path",(offset_in_ModelPackageItemInfo_to_subr *)&local_a8);
  local_b8 = MPL::ModelPackage::setRootModel;
  local_b0 = 0;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::
           def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                     (pcVar3,"setRootModel",(offset_in_ModelPackage_to_subr *)&local_b8);
  local_c8 = MPL::ModelPackage::replaceRootModel;
  local_c0 = 0;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::
           def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                     (pcVar3,"replaceRootModel",(offset_in_ModelPackage_to_subr *)&local_c8);
  local_d8 = MPL::ModelPackage::addItem;
  local_d0 = 0;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::
           def<std::__cxx11::string(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&)>
                     (pcVar3,"addItem",(offset_in_ModelPackage_to_subr *)&local_d8);
  local_e8 = MPL::ModelPackage::getRootModel;
  local_e0 = 0;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::
           def<std::shared_ptr<MPL::ModelPackageItemInfo>(MPL::ModelPackage::*)()const>
                     (pcVar3,"getRootModel",(offset_in_ModelPackageItemInfo_to_subr *)&local_e8);
  local_f0 = MPL::ModelPackage::isValid;
  pcVar3 = pybind11::class_<MPL::ModelPackage>::def<bool(*)(std::__cxx11::string_const&)>
                     (pcVar3,"isValid",&local_f0);
  local_100[0] = pybind11::detail::
                 overload_cast_impl<std::__cxx11::string_const&,std::__cxx11::string_const&>::
                 operator()(&pybind11::
                             overload_cast<std::__cxx11::string_const&,std::__cxx11::string_const&>,
                            MPL::ModelPackage::findItem,0);
  pybind11::class_<MPL::ModelPackage>::
  def<std::shared_ptr<MPL::ModelPackageItemInfo>(MPL::ModelPackage::*)(std::__cxx11::string_const&,std::__cxx11::string_const&)const>
            (pcVar3,"findItemByNameAuthor",local_100);
  pybind11::class_<MPL::ModelPackage>::~class_(&local_88);
  ppPVar4 = pybind11::handle::ptr(&local_10);
  pPVar1 = *ppPVar4;
  pybind11::module_::~module_((module_ *)&local_10);
  return pPVar1;
}

Assistant:

PYBIND11_PLUGIN(libmodelpackage) {
    py::module m("libmodelpackage", "Library to create, access and edit model packages");
    
    py::class_<MPL::ModelPackageItemInfo, std::shared_ptr<MPL::ModelPackageItemInfo>>(m, "ModelPackageItemInfo")
        .def("identifier", &MPL::ModelPackageItemInfo::identifier)
        .def("path", &MPL::ModelPackageItemInfo::path)
        .def("name", &MPL::ModelPackageItemInfo::name)
        .def("author", &MPL::ModelPackageItemInfo::author)
        .def("description", &MPL::ModelPackageItemInfo::description);
    
    py::class_<MPL::ModelPackage>(m, "ModelPackage")
        .def(py::init<const std::string&>())
        .def("path", &MPL::ModelPackage::path)
        .def("setRootModel", &MPL::ModelPackage::setRootModel)
        .def("replaceRootModel", &MPL::ModelPackage::replaceRootModel)
        .def("addItem", &MPL::ModelPackage::addItem)
        .def("getRootModel", &MPL::ModelPackage::getRootModel)
        .def("isValid", &MPL::ModelPackage::isValid)
        .def("findItemByNameAuthor", py::overload_cast<const std::string&, const std::string&>(&MPL::ModelPackage::findItem, py::const_));
    
    return m.ptr();
}